

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

result * __thiscall
lest::expression_lhs<std::byte_const&>::operator!=
          (result *__return_storage_ptr__,expression_lhs<std::byte_const&> *this,byte *rhs)

{
  lest lVar1;
  lest lVar2;
  lest *this_00;
  byte *in_R8;
  allocator<char> local_71;
  string local_70;
  string local_50 [32];
  
  this_00 = *(lest **)this;
  lVar1 = *this_00;
  lVar2 = (lest)*rhs;
  std::__cxx11::string::string<std::allocator<char>>(local_50,"!=",&local_71);
  to_string<std::byte,std::byte>(&local_70,this_00,(byte *)local_50,(string *)rhs,in_R8);
  __return_storage_ptr__->passed = lVar1 != lVar2;
  std::__cxx11::string::string((string *)&__return_storage_ptr__->decomposition,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string(local_50);
  return __return_storage_ptr__;
}

Assistant:

result operator<=( R const & rhs ) { return result( lhs <= rhs, to_string( lhs, "<=", rhs ) ); }